

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O0

int uni_sem_new(uni_sem_t *sem,uint count)

{
  void *pvVar1;
  uint count_local;
  uni_sem_t *sem_local;
  
  if (sem == (uni_sem_t *)0x0) {
    sem_local._4_4_ = -2;
  }
  else {
    pvVar1 = malloc(0x20);
    sem->hdl = pvVar1;
    if (sem->hdl == (void *)0x0) {
      sem_local._4_4_ = -1;
    }
    else {
      sem_init((sem_t *)sem->hdl,0,count);
      sem_local._4_4_ = 0;
    }
  }
  return sem_local._4_4_;
}

Assistant:

int uni_sem_new(uni_sem_t *sem, unsigned int count) {
    if (NULL_PTR_CHECK(sem)) {
        return -INVALID_IN_PARAM;
    }

    sem->hdl = malloc(sizeof(sem_t));
    if (NULL_PTR_CHECK(sem->hdl)) {
        return -OUT_OF_MEMORY;
    }

    sem_init((sem_t *)sem->hdl, 0, count);
    return OK;
}